

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skippable_text.hpp
# Opt level: O0

uint __thiscall
skippable_text<unsigned_int,_unsigned_int>::prev_non_blank_position
          (skippable_text<unsigned_int,_unsigned_int> *this,uint i)

{
  uint uVar1;
  uint64_t uVar2;
  reference pvVar3;
  uint in_ESI;
  skippable_text<unsigned_int,_unsigned_int> *in_RDI;
  uint skip_len;
  uint i_1_1;
  uint tz;
  uint i_1;
  uint64_t prev_bits;
  uint off;
  uint block;
  uint local_54;
  uint64_t local_48;
  uint local_4;
  
  uVar1 = in_ESI >> 6;
  if ((in_ESI & 0x3f) == 0) {
    local_48 = 0;
  }
  else {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&in_RDI->non_blank,(ulong)uVar1);
    local_48 = *pvVar3 >> (0x40U - (char)(in_ESI & 0x3f) & 0x3f);
  }
  if (local_48 == 0) {
    if (uVar1 == 0) {
      local_4 = in_RDI->null;
    }
    else {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&in_RDI->non_blank,(ulong)(uVar1 - 1));
      if (*pvVar3 == 0) {
        if (uVar1 == 1) {
          local_4 = in_RDI->null;
        }
        else {
          pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&in_RDI->skips,(ulong)(uVar1 - 1));
          if (in_ESI < (int)*pvVar3 + 1U) {
            local_54 = in_RDI->null;
          }
          else {
            local_54 = in_ESI - ((int)*pvVar3 + 1);
          }
          local_4 = local_54;
        }
      }
      else {
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&in_RDI->non_blank,(ulong)(uVar1 - 1));
        uVar2 = ctz(in_RDI,*pvVar3);
        local_4 = uVar1 * 0x40 - ((int)uVar2 + 1);
      }
    }
  }
  else {
    uVar2 = ctz(in_RDI,local_48);
    local_4 = in_ESI - ((int)uVar2 + 1);
  }
  return local_4;
}

Assistant:

itype prev_non_blank_position(itype i){

		assert(i<T.size());
		assert(not is_blank(i));

		itype block = i/64;
		itype off = i%64;

		uint64_t prev_bits = off == 0 ? 0 : (non_blank[block] >> (64-off));

		if(prev_bits != 0){

			//case 1: there is a non-blank position before position i inside this block

			assert(i >= (ctz( prev_bits )+1));

			itype i_1 = i - (ctz( prev_bits )+1);

			assert(not is_blank(i_1));

			return i_1;

		}

		//case 2: there isn't a non-blank position before position i inside this block

		if(block == 0) return null; //this is the first block: i is the first non-blank position

		if(non_blank[block-1] != 0){

			//case 2.1: there is a non-blank position in the previous block

			itype tz = ctz( non_blank[block-1] );

			assert(tz<64);

			itype i_1 = block*64 - (tz+1);

			assert(not is_blank(i_1));

			return i_1;

		}

		//case 2.2: there isn't a non-blank position in the previous block

		if(block-1 == 0) return null; //previous block is the first block: i is the first non-blank position

		itype skip_len = skips[block-1];

		assert(i < (skip_len+1) || not is_blank(i - (skip_len+1)));

		return i >= (skip_len+1) ? i - (skip_len+1) : null;

	}